

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t owner_excluded(archive_match *a,archive_entry *entry)

{
  long lVar1;
  wchar_t wVar2;
  int64_t iVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if ((a->inclusion_uids).count != 0) {
    iVar3 = archive_entry_uid(entry);
    uVar5 = (uint)(a->inclusion_uids).count;
    if (uVar5 == 0) {
      return L'\x01';
    }
    uVar7 = 0;
    while( true ) {
      uVar6 = uVar5 + uVar7 >> 1;
      lVar1 = (a->inclusion_uids).ids[uVar6];
      if (lVar1 == iVar3) break;
      if (lVar1 < iVar3) {
        uVar7 = uVar6 + 1;
        uVar6 = uVar5;
      }
      uVar5 = uVar6;
      if (uVar5 <= uVar7) {
        return L'\x01';
      }
    }
  }
  if ((a->inclusion_gids).count != 0) {
    iVar3 = archive_entry_gid(entry);
    uVar5 = (uint)(a->inclusion_gids).count;
    if (uVar5 == 0) {
      return L'\x01';
    }
    uVar7 = 0;
    while( true ) {
      uVar6 = uVar5 + uVar7 >> 1;
      lVar1 = (a->inclusion_gids).ids[uVar6];
      if (lVar1 == iVar3) break;
      if (lVar1 < iVar3) {
        uVar7 = uVar6 + 1;
        uVar6 = uVar5;
      }
      uVar5 = uVar6;
      if (uVar5 <= uVar7) {
        return L'\x01';
      }
    }
  }
  if ((a->inclusion_unames).count == L'\0') {
LAB_0051c4f1:
    if ((a->inclusion_gnames).count != L'\0') {
      pcVar4 = archive_entry_gname(entry);
      wVar2 = match_owner_name_mbs(a,&a->inclusion_gnames,pcVar4);
      if (wVar2 == L'\0') goto LAB_0051c521;
      if (wVar2 < L'\0') {
        return wVar2;
      }
    }
    wVar2 = L'\0';
  }
  else {
    pcVar4 = archive_entry_uname(entry);
    wVar2 = match_owner_name_mbs(a,&a->inclusion_unames,pcVar4);
    if (wVar2 != L'\0') {
      if (wVar2 < L'\0') {
        return wVar2;
      }
      goto LAB_0051c4f1;
    }
LAB_0051c521:
    wVar2 = L'\x01';
  }
  return wVar2;
}

Assistant:

static int
owner_excluded(struct archive_match *a, struct archive_entry *entry)
{
	int r;

	if (a->inclusion_uids.count) {
		if (!match_owner_id(&(a->inclusion_uids),
		    archive_entry_uid(entry)))
			return (1);
	}

	if (a->inclusion_gids.count) {
		if (!match_owner_id(&(a->inclusion_gids),
		    archive_entry_gid(entry)))
			return (1);
	}

	if (a->inclusion_unames.count) {
#if defined(_WIN32) && !defined(__CYGWIN__)
		r = match_owner_name_wcs(a, &(a->inclusion_unames),
			archive_entry_uname_w(entry));
#else
		r = match_owner_name_mbs(a, &(a->inclusion_unames),
			archive_entry_uname(entry));
#endif
		if (!r)
			return (1);
		else if (r < 0)
			return (r);
	}

	if (a->inclusion_gnames.count) {
#if defined(_WIN32) && !defined(__CYGWIN__)
		r = match_owner_name_wcs(a, &(a->inclusion_gnames),
			archive_entry_gname_w(entry));
#else
		r = match_owner_name_mbs(a, &(a->inclusion_gnames),
			archive_entry_gname(entry));
#endif
		if (!r)
			return (1);
		else if (r < 0)
			return (r);
	}
	return (0);
}